

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.h
# Opt level: O1

double __thiscall
BayesianGameIdenticalPayoff::GetUtility
          (BayesianGameIdenticalPayoff *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypeIndices,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indActionIndices)

{
  RewardModelDiscreteInterface *pRVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  Index IVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  
  pRVar1 = this->_m_utilFunction;
  IVar2 = IndexTools::IndividualToJointIndicesStepSize
                    (indTypeIndices,
                     (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     _m_stepSizeTypes);
  uVar3 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[7])(this,indActionIndices);
  UNRECOVERED_JUMPTABLE = *(pRVar1->super_QTableInterface)._vptr_QTableInterface;
  (*UNRECOVERED_JUMPTABLE)(pRVar1,(ulong)IVar2,(ulong)uVar3,UNRECOVERED_JUMPTABLE);
  return extraout_XMM0_Qa;
}

Assistant:

double GetUtility(const std::vector<Index>& indTypeIndices, 
                const std::vector<Index>& indActionIndices ) const
        {return(_m_utilFunction->Get(
                IndividualToJointTypeIndices(indTypeIndices),
                IndividualToJointActionIndices(indActionIndices) ));}